

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_import_key_into_slot(psa_key_slot_t *slot,uint8_t *data,size_t data_length)

{
  psa_ecc_curve_t pVar1;
  psa_key_bits_t pVar2;
  int iVar3;
  psa_status_t pVar4;
  size_t bit_size;
  psa_status_t status;
  size_t data_length_local;
  uint8_t *data_local;
  psa_key_slot_t *slot_local;
  
  iVar3 = key_type_is_raw_bytes((slot->attr).type);
  if (iVar3 == 0) {
    if (((slot->attr).type & 0xff00) == 0x7100) {
      if (((slot->attr).type & 0xcf00) == 0x4100) {
        pVar1 = (psa_ecc_curve_t)(slot->attr).type;
      }
      else {
        pVar1 = '\0';
      }
      bit_size._4_4_ = psa_import_ec_private_key(pVar1,data,data_length,&(slot->data).ecp);
    }
    else if (((slot->attr).type & 0xff00) == 0x4100) {
      if (((slot->attr).type & 0xcf00) == 0x4100) {
        pVar1 = (psa_ecc_curve_t)(slot->attr).type;
      }
      else {
        pVar1 = '\0';
      }
      bit_size._4_4_ = psa_import_ec_public_key(pVar1,data,data_length,&(slot->data).ecp);
    }
    else {
      if (((slot->attr).type & 0xcfff) != 0x4001) {
        return -0x86;
      }
      bit_size._4_4_ = psa_import_rsa_key((slot->attr).type,data,data_length,&(slot->data).rsa);
    }
  }
  else {
    if (0x1fffffffffffffff < data_length) {
      return -0x86;
    }
    if (0xfff8 < data_length << 3) {
      return -0x86;
    }
    pVar4 = prepare_raw_data_slot((slot->attr).type,data_length << 3,&(slot->data).raw);
    if (pVar4 != 0) {
      return pVar4;
    }
    bit_size._4_4_ = 0;
    if (data_length != 0) {
      memcpy((slot->data).raw.data,data,data_length);
    }
  }
  if (bit_size._4_4_ == 0) {
    pVar2 = psa_calculate_key_bits(slot);
    (slot->attr).bits = pVar2;
  }
  return bit_size._4_4_;
}

Assistant:

psa_status_t psa_import_key_into_slot( psa_key_slot_t *slot,
                                       const uint8_t *data,
                                       size_t data_length )
{
    psa_status_t status = PSA_SUCCESS;

    if( key_type_is_raw_bytes( slot->attr.type ) )
    {
        size_t bit_size = PSA_BYTES_TO_BITS( data_length );
        /* Ensure that the bytes-to-bit conversion didn't overflow. */
        if( data_length > SIZE_MAX / 8 )
            return( PSA_ERROR_NOT_SUPPORTED );
        /* Enforce a size limit, and in particular ensure that the bit
         * size fits in its representation type. */
        if( bit_size > PSA_MAX_KEY_BITS )
            return( PSA_ERROR_NOT_SUPPORTED );
        status = prepare_raw_data_slot( slot->attr.type, bit_size,
                                        &slot->data.raw );
        if( status != PSA_SUCCESS )
            return( status );
        if( data_length != 0 )
            memcpy( slot->data.raw.data, data, data_length );
    }
    else
#if defined(MBEDTLS_ECP_C)
    if( PSA_KEY_TYPE_IS_ECC_KEY_PAIR( slot->attr.type ) )
    {
        status = psa_import_ec_private_key( PSA_KEY_TYPE_GET_CURVE( slot->attr.type ),
                                            data, data_length,
                                            &slot->data.ecp );
    }
    else if( PSA_KEY_TYPE_IS_ECC_PUBLIC_KEY( slot->attr.type ) )
    {
        status = psa_import_ec_public_key(
            PSA_KEY_TYPE_GET_CURVE( slot->attr.type ),
            data, data_length,
            &slot->data.ecp );
    }
    else
#endif /* MBEDTLS_ECP_C */
#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PK_PARSE_C)
    if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
    {
        status = psa_import_rsa_key( slot->attr.type,
            data, data_length,
            &slot->data.rsa );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PK_PARSE_C) */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( status == PSA_SUCCESS )
    {
        /* Write the actual key size to the slot.
         * psa_start_key_creation() wrote the size declared by the
         * caller, which may be 0 (meaning unspecified) or wrong. */
        slot->attr.bits = psa_calculate_key_bits( slot );
    }
    return( status );
}